

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_sqr.c
# Opt level: O3

int BN_sqr(BIGNUM *r,BIGNUM *a,BN_CTX *ctx)

{
  uint n2;
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *a_00;
  BIGNUM *pBVar3;
  byte bVar4;
  unsigned_long *tmp;
  int iVar5;
  ulong *a_01;
  unsigned_long *r_00;
  ulong uVar6;
  unsigned_long t [32];
  unsigned_long local_138 [33];
  
  n2 = a->top;
  uVar6 = (ulong)(int)n2;
  if ((long)uVar6 < 1) {
    r->top = 0;
    r->neg = 0;
    return 1;
  }
  BN_CTX_start(ctx);
  pBVar2 = r;
  if (a == r) {
    pBVar2 = BN_CTX_get(ctx);
  }
  a_00 = BN_CTX_get(ctx);
  if (a_00 != (BIGNUM *)0x0 && pBVar2 != (BIGNUM *)0x0) {
    iVar5 = n2 * 2;
    pBVar3 = bn_wexpand((BIGNUM *)pBVar2,iVar5);
    if (pBVar3 != (BIGNUM *)0x0) {
      if (n2 == 8) {
        bn_sqr_comba8(((BIGNUM *)pBVar2)->d,a->d);
      }
      else if (n2 == 4) {
        bn_sqr_comba4(((BIGNUM *)pBVar2)->d,a->d);
      }
      else {
        if (0xf < n2) {
          iVar1 = BN_num_bits_word(uVar6);
          bVar4 = (char)iVar1 - 1;
          if (n2 == 1 << (bVar4 & 0x1f)) {
            pBVar3 = bn_wexpand((BIGNUM *)a_00,4 << (bVar4 & 0x1f));
            if (pBVar3 != (BIGNUM *)0x0) {
              bn_sqr_recursive(((BIGNUM *)pBVar2)->d,a->d,n2,a_00->d);
              goto LAB_0011582d;
            }
          }
          else {
            pBVar3 = bn_wexpand((BIGNUM *)a_00,iVar5);
            if (pBVar3 != (BIGNUM *)0x0) {
              r_00 = ((BIGNUM *)pBVar2)->d;
              a_01 = a->d;
              tmp = a_00->d;
              goto LAB_00115825;
            }
          }
          goto LAB_0011586d;
        }
        r_00 = ((BIGNUM *)pBVar2)->d;
        a_01 = a->d;
        tmp = local_138;
LAB_00115825:
        bn_sqr_normal(r_00,a_01,n2,tmp);
      }
LAB_0011582d:
      ((BIGNUM *)pBVar2)->neg = 0;
      ((BIGNUM *)pBVar2)->top = iVar5 - (uint)(*(int *)((long)a->d + uVar6 * 8 + -4) == 0);
      iVar5 = 0;
      if ((pBVar2 == r) || (pBVar2 = BN_copy(r,pBVar2), pBVar2 != (BIGNUM *)0x0)) {
        iVar5 = 1;
      }
      goto LAB_0011586f;
    }
  }
LAB_0011586d:
  iVar5 = 0;
LAB_0011586f:
  BN_CTX_end(ctx);
  return iVar5;
}

Assistant:

int BN_sqr(BIGNUM *r, const BIGNUM *a, BN_CTX *ctx)
{
    int max, al;
    int ret = GML_ERROR;
    BIGNUM *tmp, *rr;

    bn_check_top(a);

    al = a->top;
    if (al <= 0) {
        r->top = 0;
        r->neg = 0;
        return 1;
    }

    BN_CTX_start(ctx);
    rr = (a != r) ? r : BN_CTX_get(ctx);
    tmp = BN_CTX_get(ctx);
    if (!rr || !tmp)
        goto err;

    max = 2 * al;               /* Non-zero (from above) */
    if (bn_wexpand(rr, max) == NULL)
        goto err;

    if (al == 4) {
#ifndef BN_SQR_COMBA
        BN_ULONG t[8];
        bn_sqr_normal(rr->d, a->d, 4, t);
#else
        bn_sqr_comba4(rr->d, a->d);
#endif
    } else if (al == 8) {
#ifndef BN_SQR_COMBA
        BN_ULONG t[16];
        bn_sqr_normal(rr->d, a->d, 8, t);
#else
        bn_sqr_comba8(rr->d, a->d);
#endif
    } else {
#if defined(BN_RECURSION)
        if (al < BN_SQR_RECURSIVE_SIZE_NORMAL) {
            BN_ULONG t[BN_SQR_RECURSIVE_SIZE_NORMAL * 2];
            bn_sqr_normal(rr->d, a->d, al, t);
        } else {
            int j, k;

            j = BN_num_bits_word((BN_ULONG)al);
            j = 1 << (j - 1);
            k = j + j;
            if (al == j) {
                if (bn_wexpand(tmp, k * 2) == NULL)
                    goto err;
                bn_sqr_recursive(rr->d, a->d, al, tmp->d);
            } else {
                if (bn_wexpand(tmp, max) == NULL)
                    goto err;
                bn_sqr_normal(rr->d, a->d, al, tmp->d);
            }
        }
#else
        if (bn_wexpand(tmp, max) == NULL)
            goto err;
        bn_sqr_normal(rr->d, a->d, al, tmp->d);
#endif
    }

    rr->neg = 0;
    /*
     * If the most-significant half of the top word of 'a' is zero, then the
     * square of 'a' will max-1 words.
     */
    if (a->d[al - 1] == (a->d[al - 1] & BN_MASK2l))
        rr->top = max - 1;
    else
        rr->top = max;
    if (r != rr && BN_copy(r, rr) == NULL)
        goto err;

    ret = 1;
 err:
    bn_check_top(rr);
    bn_check_top(tmp);
    BN_CTX_end(ctx);
    return (ret);
}